

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  RegularExpression *this_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  ulong *puVar5;
  long lVar6;
  size_type sVar7;
  long lVar8;
  size_type lit_start;
  size_type role_start;
  string text;
  string line;
  string local_70;
  string local_50;
  
  if (this->OutputLinePending == true) {
    std::operator<<(this->OS,"\n");
    this->OutputLinePending = false;
  }
  if (!inlineMarkup) {
    poVar4 = std::operator<<(this->OS,(string *)line_in);
    std::operator<<(poVar4,"\n");
    return;
  }
  ReplaceSubstitutions(&line,this,line_in);
  this_00 = &this->CMakeRole;
  lVar8 = 0;
  do {
    role_start = 0xffffffffffffffff;
    lit_start = 0xffffffffffffffff;
    bVar3 = cmsys::RegularExpression::find(this_00,line._M_dataplus._M_p + lVar8);
    if (bVar3) {
      role_start = (long)(this->CMakeRole).regmatch.startp[0] -
                   (long)(this->CMakeRole).regmatch.searchstring;
      puVar5 = &role_start;
    }
    else {
      puVar5 = (ulong *)0x0;
    }
    bVar3 = cmsys::RegularExpression::find(&this->InlineLiteral,line._M_dataplus._M_p + lVar8);
    if (bVar3) {
      lit_start = (long)(this->InlineLiteral).regmatch.startp[0] -
                  (long)(this->InlineLiteral).regmatch.searchstring;
      if ((puVar5 == (ulong *)0x0) || (lit_start < *puVar5)) {
        puVar5 = &lit_start;
      }
    }
    bVar3 = cmsys::RegularExpression::find(&this->InlineLink,line._M_dataplus._M_p + lVar8);
    if ((bVar3) &&
       ((puVar5 == (ulong *)0x0 ||
        ((ulong)((long)(this->InlineLink).regmatch.startp[0] -
                (long)(this->InlineLink).regmatch.searchstring) < *puVar5)))) {
      poVar4 = this->OS;
      std::__cxx11::string::substr((ulong)&text,(ulong)&line);
      std::operator<<(poVar4,(string *)&text);
      std::__cxx11::string::~string((string *)&text);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&text,&(this->InlineLink).regmatch,1);
      sVar2 = text._M_string_length;
      _Var1 = text._M_dataplus;
      bVar3 = false;
      for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
        bVar3 = (bool)(_Var1._M_p[sVar7] == '\\' & ~bVar3);
        if (!bVar3) {
          std::operator<<(this->OS,_Var1._M_p[sVar7]);
        }
      }
      lVar6 = (long)(this->InlineLink).regmatch.endp[0] -
              (long)(this->InlineLink).regmatch.searchstring;
      std::__cxx11::string::~string((string *)&text);
    }
    else {
      if (puVar5 == &role_start) {
        poVar4 = this->OS;
        std::__cxx11::string::substr((ulong)&text,(ulong)&line);
        std::operator<<(poVar4,(string *)&text);
        std::__cxx11::string::~string((string *)&text);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&text,&this_00->regmatch,3);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&this_00->regmatch,2);
        bVar3 = std::operator==(&local_50,"command");
        if (bVar3) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_70,&this_00->regmatch,5);
          if (local_70._M_string_length != 0) {
            std::__cxx11::string::~string((string *)&local_70);
            goto LAB_0018a731;
          }
          lVar6 = std::__cxx11::string::find_first_of((char *)&text,0x3fd60c);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          if (lVar6 == -1) {
            std::__cxx11::string::append((char *)&text);
          }
        }
        else {
LAB_0018a731:
          std::__cxx11::string::~string((string *)&local_50);
        }
        poVar4 = std::operator<<(this->OS,"``");
        poVar4 = std::operator<<(poVar4,(string *)&text);
        std::operator<<(poVar4,"``");
        lVar6 = (long)(this->CMakeRole).regmatch.endp[0] -
                (long)(this->CMakeRole).regmatch.searchstring;
      }
      else {
        if (puVar5 != &lit_start) {
          poVar4 = this->OS;
          std::__cxx11::string::substr((ulong)&text,(ulong)&line);
          poVar4 = std::operator<<(poVar4,(string *)&text);
          std::operator<<(poVar4,"\n");
          std::__cxx11::string::~string((string *)&text);
          std::__cxx11::string::~string((string *)&line);
          return;
        }
        poVar4 = this->OS;
        std::__cxx11::string::substr((ulong)&text,(ulong)&line);
        std::operator<<(poVar4,(string *)&text);
        std::__cxx11::string::~string((string *)&text);
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&text,&(this->InlineLiteral).regmatch,1);
        lVar6 = (long)(this->InlineLiteral).regmatch.endp[0] -
                (long)(this->InlineLiteral).regmatch.searchstring;
        poVar4 = std::operator<<(this->OS,"``");
        poVar4 = std::operator<<(poVar4,(string *)&text);
        std::operator<<(poVar4,"``");
      }
      std::__cxx11::string::~string((string *)&text);
    }
    lVar8 = lVar8 + lVar6;
  } while( true );
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if (this->OutputLinePending) {
    this->OS << "\n";
    this->OutputLinePending = false;
  }
  if (inlineMarkup) {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    for (;;) {
      std::string::size_type* first = nullptr;
      std::string::size_type role_start = std::string::npos;
      std::string::size_type link_start = std::string::npos;
      std::string::size_type lit_start = std::string::npos;
      if (this->CMakeRole.find(line.c_str() + pos)) {
        role_start = this->CMakeRole.start();
        first = &role_start;
      }
      if (this->InlineLiteral.find(line.c_str() + pos)) {
        lit_start = this->InlineLiteral.start();
        if (!first || lit_start < *first) {
          first = &lit_start;
        }
      }
      if (this->InlineLink.find(line.c_str() + pos)) {
        link_start = this->InlineLink.start();
        if (!first || link_start < *first) {
          first = &link_start;
        }
      }
      if (first == &role_start) {
        this->OS << line.substr(pos, role_start);
        std::string text = this->CMakeRole.match(3);
        // If a command reference has no explicit target and
        // no explicit "(...)" then add "()" to the text.
        if (this->CMakeRole.match(2) == "command" &&
            this->CMakeRole.match(5).empty() &&
            text.find_first_of("()") == std::string::npos) {
          text += "()";
        }
        this->OS << "``" << text << "``";
        pos += this->CMakeRole.end();
      } else if (first == &lit_start) {
        this->OS << line.substr(pos, lit_start);
        std::string text = this->InlineLiteral.match(1);
        pos += this->InlineLiteral.end();
        this->OS << "``" << text << "``";
      } else if (first == &link_start) {
        this->OS << line.substr(pos, link_start);
        std::string text = this->InlineLink.match(1);
        bool escaped = false;
        for (char c : text) {
          if (escaped) {
            escaped = false;
            this->OS << c;
          } else if (c == '\\') {
            escaped = true;
          } else {
            this->OS << c;
          }
        }
        pos += this->InlineLink.end();
      } else {
        break;
      }
    }
    this->OS << line.substr(pos) << "\n";
  } else {
    this->OS << line_in << "\n";
  }
}